

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  ulong uVar1;
  TreeEnsembleParameters *from_00;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  undefined1 *puVar2;
  Arena *pAVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleClassifier_004bc398;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  from_00 = from->treeensemble_;
  if (from_00 == (TreeEnsembleParameters *)0x0 ||
      from == (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) {
    this_00 = (TreeEnsembleParameters *)0x0;
  }
  else {
    this_00 = (TreeEnsembleParameters *)operator_new(0x48);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00,from_00);
  }
  this->treeensemble_ = this_00;
  this->postevaluationtransform_ = from->postevaluationtransform_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_02 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar3);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[0] == 0x65) {
      puVar2 = (undefined1 *)(from->ClassLabels_).int64classlabels_;
    }
    else {
      puVar2 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_02,(Int64Vector *)puVar2);
  }
  else if (from->_oneof_case_[0] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 100;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar3);
    (this->ClassLabels_).stringclasslabels_ = this_01;
    if (from->_oneof_case_[0] == 100) {
      puVar2 = (undefined1 *)(from->ClassLabels_).stringclasslabels_;
    }
    else {
      puVar2 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar2);
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier(const TreeEnsembleClassifier& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_treeensemble()) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters(*from.treeensemble_);
  } else {
    treeensemble_ = nullptr;
  }
  postevaluationtransform_ = from.postevaluationtransform_;
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      _internal_mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      _internal_mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleClassifier)
}